

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O1

CURLcode tftp_multi_statemach(Curl_easy *data,_Bool *done)

{
  ulong uVar1;
  tftp_state_data *state_00;
  tftp_state_data *state_01;
  Curl_easy *data_00;
  curl_trc_feat *pcVar2;
  int iVar3;
  CURLcode CVar4;
  timediff_t tVar5;
  time_t tVar6;
  int *piVar7;
  char *pcVar8;
  ssize_t sVar9;
  ushort *puVar10;
  void *pvVar11;
  long size;
  tftp_event_t tVar12;
  size_t sVar13;
  undefined8 uVar14;
  ulong __n;
  ushort *__s;
  size_t sVar15;
  tftp_state_data *state;
  ulong uVar16;
  ushort *puVar17;
  bool bVar18;
  char buffer [256];
  char *local_170;
  ushort *local_140;
  socklen_t local_138 [66];
  
  state_00 = (data->conn->proto).tftpc;
  tVar5 = Curl_timeleft(state_00->data,(curltime *)0x0,state_00->state == TFTP_STATE_START);
  if (tVar5 < 0) {
    state_00->error = TFTP_ERR_TIMEOUT;
    state_00->state = TFTP_STATE_FIN;
LAB_0015d2ec:
    tVar12 = TFTP_EVENT_NONE;
    bVar18 = true;
  }
  else {
    tVar6 = time((time_t *)0x0);
    if (tVar6 <= (long)state_00->retry_time + state_00->rx_time) goto LAB_0015d2ec;
    bVar18 = false;
    tVar6 = time((time_t *)0x0);
    state_00->rx_time = tVar6;
    tVar12 = TFTP_EVENT_TIMEOUT;
  }
  *done = false;
  if (!bVar18) goto LAB_0015d831;
  iVar3 = Curl_socket_check(state_00->sockfd,-1,-1,0);
  if (iVar3 == 0) {
    return CURLE_OK;
  }
  if (iVar3 == -1) {
    piVar7 = __errno_location();
    pcVar8 = Curl_strerror(*piVar7,(char *)local_138,0x100);
    Curl_failf(data,"%s",pcVar8);
    state_00->event = TFTP_EVENT_ERROR;
    return CURLE_OK;
  }
  state_01 = (data->conn->proto).tftpc;
  local_138[0] = 0x80;
  CVar4 = CURLE_OK;
  sVar9 = recvfrom(state_01->sockfd,(state_01->rpacket).data,(long)state_01->blksize + 4,0,
                   (sockaddr *)&state_01->remote_addr,local_138);
  iVar3 = (int)sVar9;
  state_01->rbytes = iVar3;
  state_01->remote_addrlen = local_138[0];
  if (iVar3 < 4) {
    Curl_failf(data,"Received too short packet");
    state_01->event = TFTP_EVENT_TIMEOUT;
  }
  else {
    puVar17 = (ushort *)(state_01->rpacket).data;
    tVar12 = (tftp_event_t)(ushort)(*puVar17 << 8 | *puVar17 >> 8);
    state_01->event = tVar12;
    switch(tVar12) {
    case TFTP_EVENT_DATA:
      if (((iVar3 != 4) &&
          ((ushort)((short)*(undefined4 *)&state_01->block + 1U) ==
           (ushort)(puVar17[1] << 8 | puVar17[1] >> 8))) &&
         (CVar4 = Curl_client_write(data,1,(char *)(puVar17 + 2),(long)(iVar3 + -4)),
         CVar4 != CURLE_OK)) {
        tftp_state_machine(state_01,TFTP_EVENT_ERROR);
        goto LAB_0015d829;
      }
      break;
    case TFTP_EVENT_ACK:
      break;
    case TFTP_EVENT_ERROR:
      puVar10 = puVar17 + 2;
      state_01->error = (uint)(ushort)(puVar17[1] << 8 | puVar17[1] >> 8);
      pvVar11 = memchr(puVar10,0,(long)(iVar3 + -4));
      if (((((data != (Curl_easy *)0x0) && (pvVar11 != (void *)0x0)) &&
           ((ulong)((long)pvVar11 - (long)puVar10) < (ulong)(long)(iVar3 + -4))) &&
          (((data->set).field_0x8cd & 0x10) != 0)) &&
         ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
      {
        Curl_infof(data,"TFTP error: %s",puVar10);
      }
      break;
    case TFTP_EVENT_OACK:
      data_00 = state_01->data;
      state_01->blksize = 0x200;
      puVar10 = (ushort *)((long)puVar17 + (long)(iVar3 + -2) + 2);
      puVar17 = puVar17 + 1;
      do {
        __s = puVar17;
        __n = (long)puVar10 - (long)__s;
        pvVar11 = memchr(__s,0,__n);
        uVar16 = (long)pvVar11 - (long)__s;
        if (pvVar11 == (void *)0x0) {
          uVar16 = __n;
        }
        uVar1 = uVar16 + 1;
        sVar15 = __n - uVar1;
        if (__n < uVar1 || sVar15 == 0) {
          puVar17 = (ushort *)0x0;
          __s = local_140;
        }
        else {
          pvVar11 = memchr((void *)(uVar1 + (long)__s),0,sVar15);
          sVar13 = (long)pvVar11 - (long)(uVar1 + (long)__s);
          if (pvVar11 == (void *)0x0) {
            sVar13 = sVar15;
          }
          uVar16 = sVar13 + uVar16 + 2;
          if (__n < uVar16) {
            puVar17 = (ushort *)0x0;
          }
          else {
            sVar15 = strlen((char *)__s);
            local_170 = (char *)((long)__s + sVar15 + 1);
            puVar17 = (ushort *)(uVar16 + (long)__s);
          }
        }
        if (puVar17 == (ushort *)0x0) {
          pcVar8 = "Malformed ACK packet, rejecting";
LAB_0015d799:
          Curl_failf(data_00,pcVar8);
LAB_0015d7fd:
          bVar18 = false;
          CVar4 = CURLE_TFTP_ILLEGAL;
          goto LAB_0015d802;
        }
        if (((data_00 != (Curl_easy *)0x0) && (((data_00->set).field_0x8cd & 0x10) != 0)) &&
           ((pcVar2 = (data_00->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
            (0 < pcVar2->log_level)))) {
          Curl_infof(data_00,"got option=(%s) value=(%s)",__s,local_170);
        }
        iVar3 = curl_strnequal((char *)__s,"blksize",7);
        if (iVar3 != 0) {
          uVar16 = strtol(local_170,(char **)0x0,10);
          if (uVar16 == 0) {
            pcVar8 = "invalid blocksize value in OACK packet";
            goto LAB_0015d799;
          }
          if ((long)uVar16 < 0xffb9) {
            if (7 < (long)uVar16) {
              if ((long)state_01->requested_blksize < (long)uVar16) {
                Curl_failf(data_00,"%s (%ld)","server requested blksize larger than allocated",
                           uVar16);
                goto LAB_0015d7fd;
              }
              state_01->blksize = (int)uVar16;
              if (((data_00 != (Curl_easy *)0x0) && (((data_00->set).field_0x8cd & 0x10) != 0)) &&
                 ((pcVar2 = (data_00->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar2->log_level)))) {
                Curl_infof(data_00,"%s (%d) %s (%d)","blksize parsed from OACK",uVar16 & 0xffffffff,
                           "requested");
              }
              goto LAB_0015d74a;
            }
            pcVar8 = "blksize is smaller than min supported";
            uVar14 = 8;
          }
          else {
            pcVar8 = "blksize is larger than max supported";
            uVar14 = 0xffb8;
          }
          Curl_failf(data_00,"%s (%d)",pcVar8,uVar14);
          goto LAB_0015d7fd;
        }
        iVar3 = curl_strnequal((char *)__s,"tsize",5);
        if (iVar3 != 0) {
          size = strtol(local_170,(char **)0x0,10);
          if (((data_00 != (Curl_easy *)0x0) && (((data_00->set).field_0x8cd & 0x10) != 0)) &&
             ((pcVar2 = (data_00->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
              (0 < pcVar2->log_level)))) {
            Curl_infof(data_00,"%s (%ld)","tsize parsed from OACK",size);
          }
          if (((data_00->state).field_0x776 & 2) == 0) {
            if (size == 0) {
              Curl_failf(data_00,"invalid tsize -:%s:- value in OACK packet",local_170);
              goto LAB_0015d7fd;
            }
            Curl_pgrsSetDownloadSize(data_00,size);
          }
        }
LAB_0015d74a:
        local_140 = __s;
      } while (puVar17 < puVar10);
      CVar4 = CURLE_OK;
      bVar18 = true;
LAB_0015d802:
      if (!bVar18) goto LAB_0015d829;
      break;
    default:
      Curl_failf(data,"%s","Internal error: Unexpected packet");
    }
    iVar3 = Curl_pgrsUpdate(data);
    if (iVar3 == 0) {
      CVar4 = CURLE_OK;
    }
    else {
      tftp_state_machine(state_01,TFTP_EVENT_ERROR);
      CVar4 = CURLE_ABORTED_BY_CALLBACK;
    }
  }
LAB_0015d829:
  if (CVar4 != CURLE_OK) {
    return CVar4;
  }
  tVar12 = state_00->event;
LAB_0015d831:
  CVar4 = tftp_state_machine(state_00,tVar12);
  if (CVar4 == CURLE_OK) {
    CVar4 = CURLE_OK;
    bVar18 = state_00->state == TFTP_STATE_FIN;
    *done = bVar18;
    if (bVar18) {
      Curl_xfer_setup_nop(data);
    }
  }
  return CVar4;
}

Assistant:

static CURLcode tftp_multi_statemach(struct Curl_easy *data, bool *done)
{
  tftp_event_t event;
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct tftp_state_data *state = conn->proto.tftpc;
  timediff_t timeout_ms = tftp_state_timeout(data, &event);

  *done = FALSE;

  if(timeout_ms < 0) {
    failf(data, "TFTP response timeout");
    return CURLE_OPERATION_TIMEDOUT;
  }
  if(event != TFTP_EVENT_NONE) {
    result = tftp_state_machine(state, event);
    if(result)
      return result;
    *done = (state->state == TFTP_STATE_FIN) ? TRUE : FALSE;
    if(*done)
      /* Tell curl we are done */
      Curl_xfer_setup_nop(data);
  }
  else {
    /* no timeouts to handle, check our socket */
    int rc = SOCKET_READABLE(state->sockfd, 0);

    if(rc == -1) {
      /* bail out */
      int error = SOCKERRNO;
      char buffer[STRERROR_LEN];
      failf(data, "%s", Curl_strerror(error, buffer, sizeof(buffer)));
      state->event = TFTP_EVENT_ERROR;
    }
    else if(rc) {
      result = tftp_receive_packet(data);
      if(result)
        return result;
      result = tftp_state_machine(state, state->event);
      if(result)
        return result;
      *done = (state->state == TFTP_STATE_FIN) ? TRUE : FALSE;
      if(*done)
        /* Tell curl we are done */
        Curl_xfer_setup_nop(data);
    }
    /* if rc == 0, then select() timed out */
  }

  return result;
}